

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WindowChain(Parse *pParse,Window *pWin,Window *pList)

{
  sqlite3 *db;
  Window *pWVar1;
  ExprList *pEVar2;
  char *pcVar3;
  
  if (pWin->zBase != (char *)0x0) {
    db = pParse->db;
    pWVar1 = windowFind(pParse,pList,pWin->zBase);
    if (pWVar1 != (Window *)0x0) {
      if (pWin->pPartition == (ExprList *)0x0) {
        if ((pWVar1->pOrderBy == (ExprList *)0x0) || (pWin->pOrderBy == (ExprList *)0x0)) {
          if (pWVar1->bImplicitFrame != '\0') {
            pEVar2 = sqlite3ExprListDup(db,pWVar1->pPartition,0);
            pWin->pPartition = pEVar2;
            if (pWVar1->pOrderBy != (ExprList *)0x0) {
              pEVar2 = sqlite3ExprListDup(db,pWVar1->pOrderBy,0);
              pWin->pOrderBy = pEVar2;
            }
            if (pWin->zBase != (char *)0x0) {
              sqlite3DbFreeNN(db,pWin->zBase);
            }
            pWin->zBase = (char *)0x0;
            return;
          }
          pcVar3 = "frame specification";
        }
        else {
          pcVar3 = "ORDER BY clause";
        }
      }
      else {
        pcVar3 = "PARTITION clause";
      }
      sqlite3ErrorMsg(pParse,"cannot override %s of window: %s",pcVar3,pWin->zBase);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowChain(Parse *pParse, Window *pWin, Window *pList){
  if( pWin->zBase ){
    sqlite3 *db = pParse->db;
    Window *pExist = windowFind(pParse, pList, pWin->zBase);
    if( pExist ){
      const char *zErr = 0;
      /* Check for errors */
      if( pWin->pPartition ){
        zErr = "PARTITION clause";
      }else if( pExist->pOrderBy && pWin->pOrderBy ){
        zErr = "ORDER BY clause";
      }else if( pExist->bImplicitFrame==0 ){
        zErr = "frame specification";
      }
      if( zErr ){
        sqlite3ErrorMsg(pParse, 
            "cannot override %s of window: %s", zErr, pWin->zBase
        );
      }else{
        pWin->pPartition = sqlite3ExprListDup(db, pExist->pPartition, 0);
        if( pExist->pOrderBy ){
          assert( pWin->pOrderBy==0 );
          pWin->pOrderBy = sqlite3ExprListDup(db, pExist->pOrderBy, 0);
        }
        sqlite3DbFree(db, pWin->zBase);
        pWin->zBase = 0;
      }
    }
  }
}